

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O1

void __thiscall
QTeamCityLogger::addMessage
          (QTeamCityLogger *this,MessageTypes type,QString *message,char *file,int line)

{
  int iVar1;
  char *type_00;
  QTeamCityLogger *this_00;
  long in_FS_OFFSET;
  QTestCharBuffer escapedMessage;
  undefined1 local_260 [40];
  char local_238 [512];
  char *local_38;
  
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  if (type != QFatal) {
    iVar1 = QTestLog::verboseLevel();
    if (iVar1 < 0) goto LAB_00128daa;
  }
  memset(local_260 + 0x18,0xaa,0x210);
  local_260._24_4_ = 0x200;
  local_238[0] = '\0';
  this_00 = (QTeamCityLogger *)local_260;
  local_260._32_8_ = local_238;
  QString::toUtf8_helper((QString *)this_00);
  if ((FILE *)local_260._8_8_ == (FILE *)0x0) {
    local_260._8_8_ = &QByteArray::_empty;
  }
  tcEscapedString(this_00,(QTestCharBuffer *)(local_260 + 0x18),(char *)local_260._8_8_);
  if ((QArrayData *)local_260._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_260._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_260._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_260._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_260._0_8_,1,0x10);
    }
  }
  if (type < (Warn|QInfo)) {
    type_00 = &DAT_00157f60 + *(int *)(&DAT_00157f60 + (ulong)type * 4);
  }
  else {
    type_00 = "??????";
  }
  addPendingMessage(this,type_00,(char *)local_260._32_8_,file,line);
  if ((char *)local_260._32_8_ != local_238) {
    free((void *)local_260._32_8_);
  }
LAB_00128daa:
  if (*(char **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTeamCityLogger::addMessage(MessageTypes type, const QString &message,
                                 const char *file, int line)
{
    // suppress non-fatal messages in silent mode
    if (type != QFatal && QTestLog::verboseLevel() < 0)
        return;

    QTestCharBuffer escapedMessage;
    tcEscapedString(&escapedMessage, qUtf8Printable(message));
    addPendingMessage(QTest::tcMessageType2String(type), escapedMessage.constData(), file, line);
}